

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tile.cpp
# Opt level: O2

bool __thiscall Tile::isDataEqual(Tile *this,Tile *anotherTile)

{
  long lVar1;
  long lVar2;
  
  lVar1 = 0;
  do {
    lVar2 = lVar1;
    if (lVar2 == 0x40) break;
    lVar1 = lVar2 + 1;
  } while (this->data[lVar2] == anotherTile->data[lVar2]);
  return lVar2 == 0x40;
}

Assistant:

bool Tile::isDataEqual(Tile *anotherTile) {
    int count = 0;
    for (; count < NUM_PIXELS_IN_TILE; count++) {
        if (data[count] != anotherTile->data[count]) {
            break;
        }
    }
    if (count == NUM_PIXELS_IN_TILE) {
        return true;
    }
    return false;
}